

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

void uv__write_int(int fd,int val)

{
  ssize_t sVar1;
  int *piVar2;
  int local_1c;
  
  local_1c = val;
  do {
    sVar1 = write(fd,&local_1c,4);
    if (sVar1 != -1) {
      if (sVar1 == 4) {
        return;
      }
      goto LAB_00470a94;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (*piVar2 == 0x20) {
    return;
  }
LAB_00470a94:
  __assert_fail("n == sizeof(val)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                ,0x115,"void uv__write_int(int, int)");
}

Assistant:

static void uv__write_int(int fd, int val) {
  ssize_t n;

  do
    n = write(fd, &val, sizeof(val));
  while (n == -1 && errno == EINTR);

  if (n == -1 && errno == EPIPE)
    return; /* parent process has quit */

  assert(n == sizeof(val));
}